

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-loader.c
# Opt level: O3

void parse_bapcod_solver_json_dump(PerfProfRun *run,cJSON *root)

{
  cJSON_bool cVar1;
  int iVar2;
  cJSON *pcVar3;
  cJSON *pcVar4;
  cJSON *pcVar5;
  SolveStatus SVar6;
  cJSON *itm_cost;
  double dVar7;
  double dVar8;
  
  pcVar3 = cJSON_GetObjectItemCaseSensitive(root,"rcsp-infos");
  SVar6 = SOLVE_STATUS_PRIMAL_SOLUTION_AVAIL|SOLVE_STATUS_CLOSED_PROBLEM;
  dVar8 = 2.0;
  dVar7 = INFINITY;
  if (pcVar3 == (cJSON *)0x0) goto LAB_00104dee;
  cVar1 = cJSON_IsObject(pcVar3);
  dVar8 = 2.0;
  dVar7 = INFINITY;
  if (cVar1 == 0) goto LAB_00104dee;
  pcVar4 = cJSON_GetObjectItemCaseSensitive(pcVar3,"columnsReducedCost");
  pcVar5 = cJSON_GetObjectItemCaseSensitive(pcVar3,"seconds");
  pcVar3 = cJSON_GetObjectItemCaseSensitive(pcVar3,"pricerSuccess");
  dVar7 = INFINITY;
  if (pcVar5 != (cJSON *)0x0) {
    cVar1 = cJSON_IsNumber(pcVar5);
    dVar7 = INFINITY;
    if (cVar1 != 0) {
      dVar7 = cJSON_GetNumberValue(pcVar5);
    }
  }
  SVar6 = SOLVE_STATUS_PRIMAL_SOLUTION_AVAIL|SOLVE_STATUS_CLOSED_PROBLEM;
  dVar8 = 2.0;
  if (pcVar4 != (cJSON *)0x0) {
    cVar1 = cJSON_IsArray(pcVar4);
    if (cVar1 == 0) {
LAB_00104d92:
      dVar8 = 2.0;
    }
    else {
      iVar2 = 2;
      pcVar5 = (cJSON *)&pcVar4->child;
      do {
        pcVar5 = pcVar5->next;
        iVar2 = iVar2 + -1;
      } while (pcVar5 != (cJSON *)0x0);
      dVar8 = 2.0;
      if (iVar2 == 0) {
        pcVar4 = pcVar4->child;
        if (pcVar4 != (cJSON *)0x0) {
          cVar1 = cJSON_IsNumber(pcVar4);
          if (cVar1 == 0) goto LAB_00104d92;
          dVar8 = cJSON_GetNumberValue(pcVar4);
        }
      }
      else {
        SVar6 = SOLVE_STATUS_ERR;
      }
    }
  }
  if ((pcVar3 == (cJSON *)0x0) || (cVar1 = cJSON_IsFalse(pcVar3), cVar1 == 0)) {
    if (0.0 <= dVar8 + 1e-06) {
      SVar6 = SOLVE_STATUS_CLOSED_PROBLEM;
      dVar8 = 1.0;
    }
  }
  else {
    SVar6 = SOLVE_STATUS_ERR;
    dVar8 = 2.0;
  }
LAB_00104dee:
  (run->solution).status = SVar6;
  (run->solution).stats[0] = dVar7;
  (run->solution).stats[1] = dVar8;
  (run->solution).stats[2] = dVar8;
  return;
}

Assistant:

void parse_bapcod_solver_json_dump(PerfProfRun *run, cJSON *root) {
    cJSON *rcsp_infos = cJSON_GetObjectItemCaseSensitive(root, "rcsp-infos");

    SolveStatus status =
        SOLVE_STATUS_CLOSED_PROBLEM | SOLVE_STATUS_PRIMAL_SOLUTION_AVAIL;
    double primal_bound = CRASHED_SOLVER_DEFAULT_COST_VAL;
    double time = INFINITY;

    if (rcsp_infos && cJSON_IsObject(rcsp_infos)) {
        cJSON *columns_reduced_cost =
            cJSON_GetObjectItemCaseSensitive(rcsp_infos, "columnsReducedCost");
        cJSON *itm_took =
            cJSON_GetObjectItemCaseSensitive(rcsp_infos, "seconds");
        cJSON *pricer_success =
            cJSON_GetObjectItemCaseSensitive(rcsp_infos, "pricerSuccess");

        if (itm_took && cJSON_IsNumber(itm_took)) {
            time = cJSON_GetNumberValue(itm_took);
        }

        if (columns_reduced_cost && cJSON_IsArray(columns_reduced_cost)) {
            cJSON *elem = NULL;
            int32_t num_elems = 0;
            cJSON_ArrayForEach(elem, columns_reduced_cost) { num_elems += 1; }

            if (num_elems == 1) {
                cJSON_ArrayForEach(elem, columns_reduced_cost) {
                    cJSON *itm_cost = elem;
                    if (itm_cost && cJSON_IsNumber(itm_cost)) {
                        primal_bound = cJSON_GetNumberValue(itm_cost);
                    }
                    break;
                }
            } else {
                status = SOLVE_STATUS_ERR;
            }
        }

        //
        // Replace the cost if it is non valid negative reduced cost,
        // or if the solver crashed in the process.
        //
        if (pricer_success && cJSON_IsFalse(pricer_success)) {
            primal_bound = CRASHED_SOLVER_DEFAULT_COST_VAL;
            status = SOLVE_STATUS_ERR;
        } else if (!is_valid_reduced_cost(primal_bound)) {
            status = SOLVE_STATUS_CLOSED_PROBLEM;
            primal_bound = INFEASIBLE_SOLUTION_DEFAULT_COST_VAL;
        }
    }

    run->solution.status = status;
    run->solution.stats[PERFPROF_STAT_KIND_TIME] = time;
    run->solution.stats[PERFPROF_STAT_KIND_PRIMAL_BOUND] = primal_bound;
    run->solution.stats[PERFPROF_STAT_KIND_DUAL_BOUND] = primal_bound;
}